

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.hpp
# Opt level: O2

void __thiscall
boost::unordered::detail::
table<boost::unordered::detail::map<std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::variant<spartsi::attribute,_spartsi::ref_attribute>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::variant<spartsi::attribute,_spartsi::ref_attribute>,_boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::recalculate_max_load
          (table<boost::unordered::detail::map<std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::variant<spartsi::attribute,_spartsi::ref_attribute>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::variant<spartsi::attribute,_spartsi::ref_attribute>,_boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *this)

{
  ulong uVar1;
  double dVar2;
  
  if (this->buckets_ == (bucket_pointer)0x0) {
    uVar1 = 0;
  }
  else {
    dVar2 = ceil((((double)CONCAT44(0x45300000,(int)(this->bucket_count_ >> 0x20)) -
                  1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)this->bucket_count_) - 4503599627370496.0)) *
                 (double)this->mlf_);
    uVar1 = 0xffffffffffffffff;
    if (dVar2 < 1.8446744073709552e+19) {
      uVar1 = (long)(dVar2 - 9.223372036854776e+18) & (long)dVar2 >> 0x3f | (long)dVar2;
    }
  }
  this->max_load_ = uVar1;
  return;
}

Assistant:

void recalculate_max_load()
        {
            using namespace std;
    
            // From 6.3.1/13:
            // Only resize when size >= mlf_ * count
            max_load_ = buckets_ ? boost::unordered::detail::double_to_size(ceil(
                    static_cast<double>(mlf_) *
                    static_cast<double>(bucket_count_)
                )) : 0;

        }